

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,FileEntry *a,FileEntry *b)

{
  bool bVar1;
  StringPiece x;
  StringPiece y;
  
  x = FileEntry::name(a,this->index);
  y = FileEntry::name(b,this->index);
  bVar1 = stringpiece_internal::operator<(x,y);
  return bVar1;
}

Assistant:

bool operator()(const FileEntry& a, const FileEntry& b) const {
      return a.name(index) < b.name(index);
    }